

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  code *pcVar6;
  secp256k1_scalar *scalar_00;
  uchar y [32];
  uchar x [32];
  secp256k1_ge pt;
  secp256k1_gej res;
  uint local_18c;
  uchar *local_188;
  void *local_180;
  uint local_178 [8];
  uchar local_158 [40];
  secp256k1_ge local_130;
  secp256k1_gej local_c8;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdh_cold_4();
  }
  else if (output != (uchar *)0x0) {
    if (point == (secp256k1_pubkey *)0x0) {
      secp256k1_ecdh_cold_2();
      return 0;
    }
    if (scalar == (uchar *)0x0) {
      secp256k1_ecdh_cold_1();
      return 0;
    }
    local_188 = output;
    local_180 = data;
    secp256k1_pubkey_load(ctx,&local_130,point);
    lVar5 = 0;
    uVar3 = 0;
    local_18c = 0;
    do {
      local_18c = (uint)scalar[lVar5] | local_18c << 8;
      if (0xc < local_18c) {
        uVar3 = 1;
        local_18c = local_18c - (local_18c / 0xd + (local_18c / 0xd) * 0xc);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    pcVar6 = ecdh_hash_function_sha256;
    if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
      pcVar6 = hashfp;
    }
    local_c8.x.n[1] = (uint64_t)&local_18c;
    uVar3 = uVar3 | local_18c == 0;
    local_178[0] = uVar3;
    local_c8.x.n[0] = 0x4d430005;
    local_c8.x.n[2] = 4;
    local_c8.x.n[3] = 0;
    local_c8.x.n[4] = 0;
    local_c8.x.magnitude = 0;
    local_c8.x.normalized = 0;
    uVar1 = local_c8.x.n[1] * 8 >> 0x33;
    uVar2 = ((local_c8.x.n[1] * 8 | local_c8.x.n[1] >> 0x3d) << 0xd | uVar1) >> 3;
    scalar_00 = (secp256k1_scalar *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
    local_158[0] = '\0';
    local_158[1] = '\0';
    local_158[2] = '\0';
    local_158[3] = '\0';
    local_158[4] = '\0';
    local_158[5] = '\0';
    local_158[6] = '\0';
    local_158[7] = '\0';
    *scalar_00 = uVar3 | uVar3 - 1 & *scalar_00;
    secp256k1_ecmult_const(&local_c8,&local_130,scalar_00);
    secp256k1_ge_set_gej(&local_130,&local_c8);
    secp256k1_fe_normalize(&local_130.x);
    secp256k1_fe_normalize(&local_130.y);
    secp256k1_fe_get_b32(local_158,&local_130.x);
    secp256k1_fe_get_b32((uchar *)local_178,&local_130.y);
    iVar4 = (*pcVar6)(local_188,local_158,(uchar *)local_178,local_180);
    return (uint)(iVar4 != 0 && uVar3 == 0);
  }
  secp256k1_ecdh_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    memset(x, 0, 32);
    memset(y, 0, 32);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}